

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86instapi.cpp
# Opt level: O2

uint32_t asmjit::x86::InstInternal::stringToInstId(uint32_t arch,char *s,size_t len)

{
  byte *pbVar1;
  byte bVar2;
  ushort uVar3;
  uint uVar4;
  undefined1 *puVar5;
  ulong uVar6;
  ulong uVar7;
  size_t sVar8;
  
  if (s != (char *)0x0) {
    if (len == 0xffffffffffffffff) {
      len = strlen(s);
    }
    if ((0xffffffffffffffee < len - 0x12) && (uVar4 = (int)*s - 0x61, uVar4 < 0x1a)) {
      uVar3 = *(ushort *)(InstDB::instNameIndex + (ulong)uVar4 * 4);
      if ((ulong)uVar3 != 0) {
        puVar5 = InstDB::_instInfoTable + (uint)uVar3 * 8;
        uVar7 = (ulong)*(ushort *)(InstDB::instNameIndex + (ulong)uVar4 * 4 + 2) - (ulong)uVar3;
LAB_0012da2d:
        do {
          uVar6 = uVar7;
          if (uVar6 == 0) {
            return 0;
          }
          uVar7 = uVar6 >> 1;
          sVar8 = 0;
          do {
            if (len == sVar8) {
              if ((&InstDB::_nameData)[len + (*(uint *)(puVar5 + uVar7 * 8) & 0x3fff)] == '\0') {
                return (uint32_t)((ulong)(puVar5 + uVar7 * 8 + -0x13bb40) >> 3);
              }
              goto LAB_0012da2d;
            }
            pbVar1 = (byte *)(s + sVar8);
            bVar2 = (&InstDB::_nameData)[sVar8 + (*(uint *)(puVar5 + uVar7 * 8) & 0x3fff)];
            sVar8 = sVar8 + 1;
          } while (bVar2 == *pbVar1);
          if (bVar2 < *pbVar1) {
            puVar5 = puVar5 + uVar7 * 8 + 8;
            uVar7 = uVar6 - 1 >> 1;
          }
        } while( true );
      }
    }
  }
  return 0;
}

Assistant:

uint32_t InstInternal::stringToInstId(uint32_t arch, const char* s, size_t len) noexcept {
  DebugUtils::unused(arch);

  if (ASMJIT_UNLIKELY(!s))
    return Inst::kIdNone;

  if (len == SIZE_MAX)
    len = strlen(s);

  if (ASMJIT_UNLIKELY(len == 0 || len > InstDB::kMaxNameSize))
    return Inst::kIdNone;

  uint32_t prefix = uint32_t(s[0]) - 'a';
  if (ASMJIT_UNLIKELY(prefix > 'z' - 'a'))
    return Inst::kIdNone;

  uint32_t index = InstDB::instNameIndex[prefix].start;
  if (ASMJIT_UNLIKELY(!index))
    return Inst::kIdNone;

  const char* nameData = InstDB::_nameData;
  const InstDB::InstInfo* table = InstDB::_instInfoTable;

  const InstDB::InstInfo* base = table + index;
  const InstDB::InstInfo* end  = table + InstDB::instNameIndex[prefix].end;

  for (size_t lim = (size_t)(end - base); lim != 0; lim >>= 1) {
    const InstDB::InstInfo* cur = base + (lim >> 1);
    int result = Support::cmpInstName(nameData + cur[0]._nameDataIndex, s, len);

    if (result < 0) {
      base = cur + 1;
      lim--;
      continue;
    }

    if (result > 0)
      continue;

    return uint32_t((size_t)(cur - table));
  }

  return Inst::kIdNone;
}